

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool __thiscall cs::codecvt::utf8::is_identifier(utf8 *this,char32_t ch)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = compiler_type::issignal(L'\0');
  if (bVar1) {
    bVar1 = false;
  }
  else if ((uint)ch < 0x80) {
    bVar1 = true;
    if (ch != L'_') {
      iVar2 = iswalnum(ch);
      bVar1 = iVar2 != 0;
    }
  }
  else {
    bVar1 = ch == L'〇' || (uint)(ch + L'\xffffb200') < 0x51f0;
  }
  return bVar1;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in Unicode Charset
				 * Basic:    0x4E00 - 0x9FA5
				 * Extended: 0x9FA6 - 0x9FEF
				 * Special:  0x3007
				 */
				if (ch > ascii_max)
					return (ch >= 0x4E00 && ch <= 0x9FA5) || (ch >= 0x9FA6 && ch <= 0x9FEF) || ch == 0x3007;
				else
					return ch == '_' || std::iswalnum(ch);
			}